

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtMultiSphereShape * __thiscall
cbtCollisionWorldImporter::createMultiSphereShape
          (cbtCollisionWorldImporter *this,cbtVector3 *positions,cbtScalar *radi,int numSpheres)

{
  int iVar1;
  int iVar2;
  cbtCollisionShape **ptr;
  cbtMultiSphereShape *this_00;
  cbtCollisionShape **ppcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this_00 = (cbtMultiSphereShape *)cbtAlignedAllocInternal(0xa8,0x10);
  cbtMultiSphereShape::cbtMultiSphereShape(this_00,positions,radi,numSpheres);
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
  if (iVar1 == iVar2) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppcVar3 = (cbtCollisionShape **)0x0;
      }
      else {
        ppcVar3 = (cbtCollisionShape **)cbtAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppcVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_allocatedCollisionShapes).m_data;
      if (ptr != (cbtCollisionShape **)0x0) {
        if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_allocatedCollisionShapes).m_data = (cbtCollisionShape **)0x0;
      }
      (this->m_allocatedCollisionShapes).m_ownsMemory = true;
      (this->m_allocatedCollisionShapes).m_data = ppcVar3;
      (this->m_allocatedCollisionShapes).m_capacity = iVar6;
    }
  }
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  (this->m_allocatedCollisionShapes).m_data[iVar1] = (cbtCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = iVar1 + 1;
  return this_00;
}

Assistant:

cbtMultiSphereShape* cbtCollisionWorldImporter::createMultiSphereShape(const cbtVector3* positions, const cbtScalar* radi, int numSpheres)
{
	cbtMultiSphereShape* shape = new cbtMultiSphereShape(positions, radi, numSpheres);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}